

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O1

int ftpfilemethod(OperationConfig *config,char *str)

{
  int iVar1;
  int iVar2;
  
  iVar1 = curl_strequal("singlecwd");
  iVar2 = 3;
  if (iVar1 == 0) {
    iVar1 = curl_strequal("nocwd",str);
    iVar2 = 2;
    if (iVar1 == 0) {
      iVar1 = curl_strequal("multicwd",str);
      iVar2 = 1;
      if (iVar1 == 0) {
        warnf(config->global,"unrecognized ftp file method \'%s\', using default\n",str);
      }
    }
  }
  return iVar2;
}

Assistant:

int ftpfilemethod(struct OperationConfig *config, const char *str)
{
  if(curl_strequal("singlecwd", str))
    return CURLFTPMETHOD_SINGLECWD;
  if(curl_strequal("nocwd", str))
    return CURLFTPMETHOD_NOCWD;
  if(curl_strequal("multicwd", str))
    return CURLFTPMETHOD_MULTICWD;

  warnf(config->global, "unrecognized ftp file method '%s', using default\n",
        str);

  return CURLFTPMETHOD_MULTICWD;
}